

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GetTextureSubImage::Errors::testBufferSizeError(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  char *local_350;
  MessageBuilder local_348;
  uint local_1c4;
  char *pcStack_1c0;
  GLint is_proper_error_compressed;
  MessageBuilder local_1a8;
  uint local_28;
  int local_24;
  GLint is_proper_error;
  GLint error_value;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _is_proper_error = CONCAT44(extraout_var,iVar1);
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_2D,0,0,0,0,2,2,1,0x1908,0x1401,1,this->m_destination_buffer);
  local_24 = (**(code **)(_is_proper_error + 0x800))();
  local_28 = (uint)(local_24 == 0x502);
  if (local_28 == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [234])
                        "GL_INVALID_OPERATION error is expected to be generated by glGetTextureSubImage if the buffer size required to store the requested data is greater than bufSize. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                       );
    pcStack_1c0 = glu::getErrorName(local_24);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (this->m_texture_2D_compressed,0,0,0,0,4,4,1,1,this->m_destination_buffer);
  local_24 = (**(code **)(_is_proper_error + 0x800))();
  local_1c4 = (uint)(local_24 == 0x502);
  if (local_1c4 == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_348,
                        (char (*) [244])
                        "GL_INVALID_OPERATION error is expected to be generated by glGetCompressedTextureSubImage if the buffer size required to store the requested data is greater than bufSize. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                       );
    local_350 = glu::getErrorName(local_24);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_350);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
  }
  if ((local_28 == 0) || (local_1c4 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testBufferSizeError()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test for uncompressed texture. */
	m_gl_GetTextureSubImage(m_texture_2D, 0, 0, 0, 0, s_texture_data_width, s_texture_data_height, 1, GL_RGBA,
							GL_UNSIGNED_BYTE, 1, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_OPERATION == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_INVALID_OPERATION error is expected to be generated by glGetTextureSubImage if the buffer"
			   " size required to store the requested data is greater than bufSize. (OpenGL 4.5 Core Specification "
			   "chapter 8.11.4)."
			   " However, the error value "
			<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	/* Test for compressed texture. */
	m_gl_GetCompressedTextureSubImage(m_texture_2D_compressed, 0, 0, 0, 0, s_texture_data_compressed_width,
									  s_texture_data_compressed_height, 1, 1, m_destination_buffer);

	error_value = gl.getError();

	glw::GLint is_proper_error_compressed = (GL_INVALID_OPERATION == error_value);

	if (!is_proper_error_compressed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_INVALID_OPERATION error is expected to be generated by glGetCompressedTextureSubImage if the buffer"
			   " size required to store the requested data is greater than bufSize. (OpenGL 4.5 Core Specification "
			   "chapter 8.11.4)."
			   " However, the error value "
			<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	/* Return results. */
	if (is_proper_error && is_proper_error_compressed)
	{
		return true;
	}

	return false;
}